

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O1

string * __thiscall
xla::GraphCycles::DebugString_abi_cxx11_(string *__return_storage_ptr__,GraphCycles *this)

{
  uint uVar1;
  __node_base_ptr p_Var2;
  _Hash_node_base *p_Var3;
  pointer pNVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  __node_base_ptr p_Var8;
  long *plVar9;
  undefined8 *puVar10;
  long *plVar11;
  ulong *puVar12;
  ulong uVar13;
  __node_base_ptr p_Var14;
  uint *puVar15;
  int iVar16;
  uint __len;
  uint uVar17;
  string __str_1;
  string __str;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> free_nodes_set;
  ulong *local_158;
  long local_150;
  ulong local_148 [2];
  long *local_138;
  undefined8 local_130;
  long local_128;
  undefined8 uStack_120;
  ulong *local_118;
  long local_110;
  ulong local_108;
  long lStack_100;
  string *local_f8;
  ulong local_f0;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  long *local_a8 [2];
  long local_98 [2];
  GraphCycles *local_88;
  ulong local_80;
  uint *local_78;
  uint *local_70;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  std::
  _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&local_68,
             (this->rep_->free_nodes_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->rep_->free_nodes_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish,0,&local_c8,&local_138,&local_118);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"digraph {\n","")
  ;
  local_80 = (long)(this->rep_->nodes_).
                   super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->rep_->nodes_).
                   super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3;
  local_88 = this;
  if (0 < (long)local_80) {
    uVar13 = 0;
    local_f8 = __return_storage_ptr__;
    do {
      iVar16 = (int)uVar13;
      p_Var2 = local_68._M_buckets[(ulong)(long)iVar16 % local_68._M_bucket_count];
      p_Var8 = (__node_base_ptr)0x0;
      if ((p_Var2 != (__node_base_ptr)0x0) &&
         (p_Var8 = p_Var2, p_Var14 = p_Var2->_M_nxt, *(int *)&p_Var2->_M_nxt[1]._M_nxt != iVar16)) {
        while (p_Var3 = p_Var14->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
          p_Var8 = (__node_base_ptr)0x0;
          if (((ulong)(long)*(int *)&p_Var3[1]._M_nxt % local_68._M_bucket_count !=
               (ulong)(long)iVar16 % local_68._M_bucket_count) ||
             (p_Var8 = p_Var14, p_Var14 = p_Var3, *(int *)&p_Var3[1]._M_nxt == iVar16))
          goto LAB_001b0d0e;
        }
        p_Var8 = (__node_base_ptr)0x0;
      }
LAB_001b0d0e:
      if ((p_Var8 != (__node_base_ptr)0x0) && (p_Var8->_M_nxt != (_Hash_node_base *)0x0)) {
        pNVar4 = (local_88->rep_->node_io_).
                 super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar15 = *(uint **)&pNVar4[uVar13].out.value_sequence_.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl;
        local_78 = *(uint **)((long)&pNVar4[uVar13].out.value_sequence_.
                                     super__Vector_base<int,_std::allocator<int>_> + 8);
        if (puVar15 != local_78) {
          do {
            local_f0 = uVar13;
            uVar17 = 1;
            if (9 < local_f0) {
              uVar13 = local_f0;
              uVar1 = 4;
              do {
                uVar17 = uVar1;
                if (uVar13 < 100) {
                  uVar17 = uVar17 - 2;
                  goto LAB_001b0db8;
                }
                if (uVar13 < 1000) {
                  uVar17 = uVar17 - 1;
                  goto LAB_001b0db8;
                }
                if (uVar13 < 10000) goto LAB_001b0db8;
                bVar5 = 99999 < uVar13;
                uVar13 = uVar13 / 10000;
                uVar1 = uVar17 + 4;
              } while (bVar5);
              uVar17 = uVar17 + 1;
            }
LAB_001b0db8:
            uVar1 = *puVar15;
            local_a8[0] = local_98;
            local_70 = puVar15;
            std::__cxx11::string::_M_construct((ulong)local_a8,(char)uVar17);
            std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_a8[0],uVar17,local_f0);
            plVar9 = (long *)std::__cxx11::string::replace((ulong)local_a8,0,(char *)0x0,0x1c6120);
            local_e8 = &local_d8;
            plVar11 = plVar9 + 2;
            if ((long *)*plVar9 == plVar11) {
              local_d8 = *plVar11;
              lStack_d0 = plVar9[3];
            }
            else {
              local_d8 = *plVar11;
              local_e8 = (long *)*plVar9;
            }
            local_e0 = plVar9[1];
            *plVar9 = (long)plVar11;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
            puVar12 = (ulong *)(plVar9 + 2);
            if ((ulong *)*plVar9 == puVar12) {
              local_108 = *puVar12;
              lStack_100 = plVar9[3];
              local_118 = &local_108;
            }
            else {
              local_108 = *puVar12;
              local_118 = (ulong *)*plVar9;
            }
            local_110 = plVar9[1];
            *plVar9 = (long)puVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            uVar17 = -uVar1;
            if (0 < (int)uVar1) {
              uVar17 = uVar1;
            }
            __len = 1;
            if (9 < uVar17) {
              uVar13 = (ulong)uVar17;
              uVar6 = 4;
              do {
                __len = uVar6;
                uVar7 = (uint)uVar13;
                if (uVar7 < 100) {
                  __len = __len - 2;
                  goto LAB_001b0f1e;
                }
                if (uVar7 < 1000) {
                  __len = __len - 1;
                  goto LAB_001b0f1e;
                }
                if (uVar7 < 10000) goto LAB_001b0f1e;
                uVar13 = uVar13 / 10000;
                uVar6 = __len + 4;
              } while (99999 < uVar7);
              __len = __len + 1;
            }
LAB_001b0f1e:
            local_158 = local_148;
            std::__cxx11::string::_M_construct
                      ((ulong)&local_158,(char)__len - (char)((int)uVar1 >> 0x1f));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)((ulong)(uVar1 >> 0x1f) + (long)local_158),__len,uVar17);
            __return_storage_ptr__ = local_f8;
            uVar13 = 0xf;
            if (local_118 != &local_108) {
              uVar13 = local_108;
            }
            if (uVar13 < (ulong)(local_150 + local_110)) {
              uVar13 = 0xf;
              if (local_158 != local_148) {
                uVar13 = local_148[0];
              }
              if (uVar13 < (ulong)(local_150 + local_110)) goto LAB_001b0fa7;
              puVar10 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_158,0,(char *)0x0,(ulong)local_118);
            }
            else {
LAB_001b0fa7:
              puVar10 = (undefined8 *)
                        std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_158);
            }
            plVar9 = puVar10 + 2;
            if ((long *)*puVar10 == plVar9) {
              local_128 = *plVar9;
              uStack_120 = puVar10[3];
              local_138 = &local_128;
            }
            else {
              local_128 = *plVar9;
              local_138 = (long *)*puVar10;
            }
            local_130 = puVar10[1];
            *puVar10 = plVar9;
            puVar10[1] = 0;
            *(undefined1 *)plVar9 = 0;
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_138);
            plVar11 = plVar9 + 2;
            if ((long *)*plVar9 == plVar11) {
              local_b8 = *plVar11;
              lStack_b0 = plVar9[3];
              local_c8 = &local_b8;
            }
            else {
              local_b8 = *plVar11;
              local_c8 = (long *)*plVar9;
            }
            local_c0 = plVar9[1];
            *plVar9 = (long)plVar11;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_c8);
            if (local_c8 != &local_b8) {
              operator_delete(local_c8,local_b8 + 1);
            }
            if (local_138 != &local_128) {
              operator_delete(local_138,local_128 + 1);
            }
            if (local_158 != local_148) {
              operator_delete(local_158,local_148[0] + 1);
            }
            if (local_118 != &local_108) {
              operator_delete(local_118,local_108 + 1);
            }
            if (local_e8 != &local_d8) {
              operator_delete(local_e8,local_d8 + 1);
            }
            if (local_a8[0] != local_98) {
              operator_delete(local_a8[0],local_98[0] + 1);
            }
            puVar15 = local_70 + 1;
            uVar13 = local_f0;
          } while (puVar15 != local_78);
        }
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != local_80);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string GraphCycles::DebugString() const {
  std::unordered_set<int32_t> free_nodes_set(rep_->free_nodes_.begin(),
                                              rep_->free_nodes_.end());

  std::string result = "digraph {\n";
  for (int64_t i = 0, end = rep_->nodes_.size(); i < end; i++) {
    int32_t index = static_cast<int32_t>(i);
    if (!contains(free_nodes_set, index)) {
      continue;
    }

    for (int32_t succ : rep_->node_io_[i].out.GetSequence()) {
      result += "  \"" + std::to_string(i) + "\" -> \"" + std::to_string(succ) + "\"\n";
    }
  }

  result += "}\n";

  return result;
}